

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::binary_op_rpow>(Mat *a,float b,Option *opt)

{
  binary_op_rpow *this;
  long *in_RDI;
  float fVar1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_rpow op;
  Mat *m;
  float *in_stack_fffffffffffffea8;
  int local_124;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_108;
  long local_100;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined8 local_e0;
  binary_op_rpow *local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  long *local_b0;
  undefined8 *local_a8;
  undefined1 local_9d;
  int local_9c;
  undefined8 *local_90;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  binary_op_rpow *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined8 *local_18;
  
  local_c8 = (int)in_RDI[7];
  local_cc = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34);
  local_b0 = in_RDI;
  for (local_d0 = 0; local_d0 < local_c8; local_d0 = local_d0 + 1) {
    local_90 = &local_120;
    local_4c = *(int *)((long)local_b0 + 0x2c);
    local_50 = (int)local_b0[6];
    local_54 = *(undefined4 *)((long)local_b0 + 0x34);
    this = (binary_op_rpow *)(*local_b0 + local_b0[8] * (long)local_d0 * local_b0[2]);
    local_68 = local_b0[2];
    local_6c = (undefined4)local_b0[3];
    local_78 = local_b0[4];
    local_48 = &local_120;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_80 = &local_120;
    local_a8 = &local_120;
    local_3c = 0x10;
    local_9c = local_d0;
    local_9d = 1;
    local_120 = 0;
    local_110 = 0;
    local_108 = 0;
    local_f8 = 0;
    local_f4 = 0;
    local_f0 = 0;
    local_ec = 0;
    local_e8 = 0;
    local_e0 = 0;
    local_118 = 0;
    local_d8 = this;
    local_60 = this;
    local_18 = local_a8;
    local_100 = local_78;
    for (local_124 = 0; local_124 < local_cc; local_124 = local_124 + 1) {
      fVar1 = binary_op_rpow::operator()(this,in_stack_fffffffffffffea8,(float *)0xfeb4ab);
      *(float *)(local_d8 + (long)local_124 * 4) = fVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}